

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O0

void srunner_register_lfun(SRunner *sr,FILE *lfile,int close,LFun lfun,print_output printmode)

{
  undefined8 *val;
  Log *l;
  print_output printmode_local;
  LFun lfun_local;
  int close_local;
  FILE *lfile_local;
  SRunner *sr_local;
  
  val = (undefined8 *)emalloc(0x18);
  l._4_4_ = printmode;
  if (printmode == CK_ENV) {
    l._4_4_ = get_env_printmode();
  }
  *val = lfile;
  val[1] = lfun;
  *(int *)(val + 2) = close;
  *(print_output *)((long)val + 0x14) = l._4_4_;
  check_list_add_end(sr->loglst,val);
  return;
}

Assistant:

void srunner_register_lfun(SRunner * sr, FILE * lfile, int close,
                           LFun lfun, enum print_output printmode)
{
    Log *l = (Log *)emalloc(sizeof(Log));

    if(printmode == CK_ENV)
    {
        printmode = get_env_printmode();
    }

    l->lfile = lfile;
    l->lfun = lfun;
    l->close = close;
    l->mode = printmode;
    check_list_add_end(sr->loglst, l);
    return;
}